

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<long,_3> * __thiscall
TPZManVector<long,_3>::operator=(TPZManVector<long,_3> *this,TPZManVector<long,_3> *rval)

{
  ulong uVar1;
  long *plVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  
  if (this != rval) {
    uVar1 = (rval->super_TPZVec<long>).fNElements;
    plVar2 = (this->super_TPZVec<long>).fStore;
    plVar7 = this->fExtAlloc;
    if (plVar2 != plVar7 && plVar2 != (long *)0x0) {
      operator_delete__(plVar2);
      (this->super_TPZVec<long>).fStore = (long *)0x0;
      (this->super_TPZVec<long>).fNAlloc = 0;
    }
    if ((long)uVar1 < 4) {
      uVar5 = 0;
      uVar4 = 0;
      if (0 < (long)uVar1) {
        uVar4 = uVar1;
      }
      iVar3 = (int)uVar4;
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        plVar7[uVar5] = rval->fExtAlloc[uVar5];
      }
      for (; uVar6 = 0, (uint)((3 - iVar3) + (int)uVar5) != uVar4; uVar4 = uVar4 + 1) {
        plVar7[uVar4] = 0;
      }
    }
    else {
      plVar7 = (rval->super_TPZVec<long>).fStore;
      uVar6 = uVar1;
    }
    (this->super_TPZVec<long>).fStore = plVar7;
    (this->super_TPZVec<long>).fNAlloc = uVar6;
    (this->super_TPZVec<long>).fNElements = uVar1;
  }
  (rval->super_TPZVec<long>).fStore = (long *)0x0;
  (rval->super_TPZVec<long>).fNElements = 0;
  (rval->super_TPZVec<long>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}